

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this,dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  size_type sVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  ulong uVar12;
  size_type sVar13;
  float fVar14;
  
  iVar9 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          super_TransparentHasher.super_Hasher.id_;
  iVar10 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
           super_TransparentHasher.super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
            super_TransparentHasher.super_Hasher.num_compares_;
  sVar13 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
           enlarge_threshold_;
  sVar2 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar14 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
           shrink_factor_;
  bVar4 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          consider_shrink_;
  bVar5 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          use_empty_;
  bVar6 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          use_deleted_;
  uVar7 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          field_0x2b;
  uVar8 = (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
       enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_factor_ = fVar14;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = bVar4;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.use_empty_
       = bVar5;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_deleted_ = bVar6;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.field_0x2b
       = uVar7;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  num_ht_copies_ = uVar8;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = sVar13;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = sVar2;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.id_ = iVar9;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.num_hashes_ = iVar10;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    super_TransparentHasher.super_Hasher.num_compares_ = uVar1;
  iVar9 = (ht->key_info).super_TransparentHasher.super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)&(ht->key_info).super_TransparentHasher.super_Hasher.num_compares_;
  (this->key_info).super_TransparentHasher.super_Hasher.id_ =
       (ht->key_info).super_TransparentHasher.super_Hasher.id_;
  (this->key_info).super_TransparentHasher.super_Hasher.num_hashes_ = iVar9;
  *(undefined8 *)&(this->key_info).super_TransparentHasher.super_Hasher.num_compares_ = uVar1;
  (this->key_info).empty_key = (ht->key_info).empty_key;
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = 0;
  uVar11 = *(undefined4 *)
            &(ht->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
             super_Alloc<int,_unsigned_long,_18446744073709551615UL>.field_0x4;
  piVar3 = (ht->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_;
  (this->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<int,_unsigned_long,_18446744073709551615UL>.id_ =
       (ht->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
       super_Alloc<int,_unsigned_long,_18446744073709551615UL>.id_;
  *(undefined4 *)
   &(this->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
    super_Alloc<int,_unsigned_long,_18446744073709551615UL>.field_0x4 = uVar11;
  (this->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_ = piVar3;
  this->table = (pointer)0x0;
  if ((ht->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
      use_empty_ != false) {
    fVar14 = (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
             enlarge_factor_ * 0.0;
    uVar12 = (ulong)fVar14;
    (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar14 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12;
    fVar14 = (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
             shrink_factor_ * 0.0;
    uVar12 = (ulong)fVar14;
    (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar14 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12;
    (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::
    copy_or_move_from<google::dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
              ((dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this,ht,min_buckets_wanted);
    return;
  }
  sVar13 = sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
           min_buckets((sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)this,
                       ht->num_elements - ht->num_deleted,min_buckets_wanted);
  this->num_buckets = sVar13;
  fVar14 = (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
           enlarge_factor_ * (float)sVar13;
  uVar12 = (ulong)fVar14;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar14 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12;
  fVar14 = (float)sVar13 *
           (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
           shrink_factor_;
  uVar12 = (ulong)fVar14;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar14 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }